

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

int __thiscall basist::ktx2_transcoder::init(ktx2_transcoder *this,EVP_PKEY_CTX *ctx)

{
  uint8_t *puVar1;
  bool bVar2;
  uint uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  int iVar7;
  undefined7 extraout_var;
  ktx2_transcoder *pkVar8;
  ktx2_level_index *__dest;
  packed_uint<4U> *this_00;
  undefined7 extraout_var_00;
  uchar *puVar9;
  undefined7 extraout_var_01;
  key_value *this_01;
  uint in_EDX;
  uint32_t i_1;
  uint32_t sample_channel1;
  uint32_t sample_channel0;
  uint32_t dfd_bits;
  uint32_t dfd_total_size;
  uint8_t *pDFD;
  uint32_t DFD_MAXIMUM_SIZE;
  uint32_t DFD_MINIMUM_SIZE;
  uint64_t MAX_SANE_LEVEL_UNCOMP_SIZE;
  uint32_t i;
  uint32_t level_index_size_in_bytes;
  undefined4 in_stack_ffffffffffffff48;
  undefined3 uVar10;
  undefined4 in_stack_ffffffffffffff4c;
  uint32_t in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff54;
  undefined8 in_stack_ffffffffffffff58;
  undefined1 grow_hint;
  packed_uint<4U> *in_stack_ffffffffffffff60;
  packed_uint<4U> *this_02;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  uint32_t in_stack_ffffffffffffff88;
  uint local_54;
  uint local_24;
  undefined1 local_1;
  
  clear((ktx2_transcoder *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  if (ctx == (EVP_PKEY_CTX *)0x0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                  ,0x4105,"bool basist::ktx2_transcoder::init(const void *, uint32_t)");
  }
  if ((ktx2_transcoder *)(ulong)in_EDX < (ktx2_transcoder *)0x51) {
    local_1 = 0;
    this = (ktx2_transcoder *)(ulong)in_EDX;
  }
  else {
    uVar3 = memcmp(ctx,&g_ktx2_file_identifier,0xc);
    if (uVar3 == 0) {
      this->m_pData = (uint8_t *)ctx;
      this->m_data_size = in_EDX;
      memcpy(&this->m_header,ctx,0x50);
      uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int(in_stack_ffffffffffffff60);
      if (uVar4 == 0) {
        uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int(in_stack_ffffffffffffff60);
        if (uVar4 == 1) {
          uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int(in_stack_ffffffffffffff60);
          pkVar8 = (ktx2_transcoder *)(ulong)uVar4;
          if (uVar4 != 0) {
            uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int(in_stack_ffffffffffffff60);
            pkVar8 = (ktx2_transcoder *)(ulong)uVar4;
            if (uVar4 != 0) {
              uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int(in_stack_ffffffffffffff60);
              pkVar8 = (ktx2_transcoder *)(ulong)uVar4;
              if (uVar4 == 0) {
                uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int
                                  (in_stack_ffffffffffffff60);
                if (uVar4 != 1) {
                  uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int
                                    (in_stack_ffffffffffffff60);
                  if (uVar4 != 6) {
                    local_1 = 0;
                    this = (ktx2_transcoder *)(ulong)uVar4;
                    goto LAB_001c856b;
                  }
                }
                uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int
                                  (in_stack_ffffffffffffff60);
                if (1 < uVar4) {
                  uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int
                                    (in_stack_ffffffffffffff60);
                  uVar5 = basisu::packed_uint::operator_cast_to_unsigned_int
                                    (in_stack_ffffffffffffff60);
                  if (uVar4 != uVar5) {
                    local_1 = 0;
                    this = (ktx2_transcoder *)(ulong)uVar4;
                    goto LAB_001c856b;
                  }
                }
                uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int
                                  (in_stack_ffffffffffffff60);
                if (uVar4 == 0) {
                  local_1 = 0;
                  this = (ktx2_transcoder *)(ulong)uVar4;
                }
                else {
                  uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int
                                    (in_stack_ffffffffffffff60);
                  if (uVar4 < 0x11) {
                    uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int
                                      (in_stack_ffffffffffffff60);
                    if (uVar4 < 3) {
                      uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int
                                        (in_stack_ffffffffffffff60);
                      if (uVar4 == 1) {
                        uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int
                                          ((packed_uint<8U> *)
                                           CONCAT44(in_stack_ffffffffffffff54,
                                                    in_stack_ffffffffffffff50));
                        if ((ktx2_transcoder *)(ulong)uVar4 < (ktx2_transcoder *)0x15) {
                          local_1 = 0;
                          this = (ktx2_transcoder *)(ulong)uVar4;
                          goto LAB_001c856b;
                        }
                        uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int
                                          ((packed_uint<8U> *)
                                           CONCAT44(in_stack_ffffffffffffff54,
                                                    in_stack_ffffffffffffff50));
                        if ((ktx2_transcoder *)(ulong)uVar4 < (ktx2_transcoder *)0x50) {
                          local_1 = 0;
                          this = (ktx2_transcoder *)(ulong)uVar4;
                          goto LAB_001c856b;
                        }
                        uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int
                                          ((packed_uint<8U> *)
                                           CONCAT44(in_stack_ffffffffffffff54,
                                                    in_stack_ffffffffffffff50));
                        uVar5 = basisu::packed_uint::operator_cast_to_unsigned_int
                                          ((packed_uint<8U> *)
                                           CONCAT44(in_stack_ffffffffffffff54,
                                                    in_stack_ffffffffffffff50));
                        if (this->m_data_size < uVar4 + uVar5) {
                          local_1 = 0;
                          this = (ktx2_transcoder *)(ulong)(uVar4 + uVar5);
                          goto LAB_001c856b;
                        }
                      }
                      basisu::packed_uint::operator_cast_to_unsigned_int(in_stack_ffffffffffffff60);
                      bVar2 = basisu::vector<basist::ktx2_level_index>::try_resize
                                        ((vector<basist::ktx2_level_index> *)
                                         CONCAT44(in_stack_ffffffffffffff6c,
                                                  in_stack_ffffffffffffff68),
                                         (size_t)in_stack_ffffffffffffff60,
                                         SUB81((ulong)in_stack_ffffffffffffff58 >> 0x38,0));
                      if (bVar2) {
                        uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int
                                          (in_stack_ffffffffffffff60);
                        uVar3 = basisu::maximum<unsigned_int>(1,uVar4);
                        pkVar8 = (ktx2_transcoder *)((ulong)(uVar3 * 0x18) + 0x50);
                        if ((ktx2_transcoder *)(ulong)this->m_data_size < pkVar8) {
                          local_1 = 0;
                          this = pkVar8;
                        }
                        else {
                          __dest = basisu::vector<basist::ktx2_level_index>::operator[]
                                             ((vector<basist::ktx2_level_index> *)
                                              CONCAT44(in_stack_ffffffffffffff54,
                                                       in_stack_ffffffffffffff50),
                                              CONCAT44(in_stack_ffffffffffffff4c,
                                                       in_stack_ffffffffffffff48));
                          memcpy(__dest,this->m_pData + 0x50,(ulong)(uVar3 * 0x18));
                          local_24 = 0;
                          while( true ) {
                            uVar3 = local_24;
                            uVar4 = basisu::vector<basist::ktx2_level_index>::size(&this->m_levels);
                            grow_hint = (undefined1)((ulong)in_stack_ffffffffffffff58 >> 0x38);
                            if (uVar4 <= uVar3) break;
                            basisu::vector<basist::ktx2_level_index>::operator[]
                                      ((vector<basist::ktx2_level_index> *)
                                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
                                       ,CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48
                                                ));
                            uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int
                                              ((packed_uint<8U> *)
                                               CONCAT44(in_stack_ffffffffffffff54,
                                                        in_stack_ffffffffffffff50));
                            if ((ktx2_transcoder *)(ulong)uVar4 < (ktx2_transcoder *)0x50) {
                              local_1 = 0;
                              this = (ktx2_transcoder *)(ulong)uVar4;
                              goto LAB_001c856b;
                            }
                            basisu::vector<basist::ktx2_level_index>::operator[]
                                      ((vector<basist::ktx2_level_index> *)
                                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
                                       ,CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48
                                                ));
                            basisu::packed_uint::operator_cast_to_unsigned_int
                                      ((packed_uint<8U> *)
                                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
                                      );
                            basisu::vector<basist::ktx2_level_index>::operator[]
                                      ((vector<basist::ktx2_level_index> *)
                                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
                                       ,CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48
                                                ));
                            in_stack_ffffffffffffff88 =
                                 basisu::packed_uint::operator_cast_to_unsigned_int
                                           ((packed_uint<8U> *)
                                            CONCAT44(in_stack_ffffffffffffff54,
                                                     in_stack_ffffffffffffff50));
                            basisu::vector<basist::ktx2_level_index>::operator[]
                                      ((vector<basist::ktx2_level_index> *)
                                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
                                       ,CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48
                                                ));
                            uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int
                                              ((packed_uint<8U> *)
                                               CONCAT44(in_stack_ffffffffffffff54,
                                                        in_stack_ffffffffffffff50));
                            if (this->m_data_size < in_stack_ffffffffffffff88 + uVar4) {
                              local_1 = 0;
                              this = (ktx2_transcoder *)(ulong)(in_stack_ffffffffffffff88 + uVar4);
                              goto LAB_001c856b;
                            }
                            basisu::vector<basist::ktx2_level_index>::operator[]
                                      ((vector<basist::ktx2_level_index> *)
                                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
                                       ,CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48
                                                ));
                            uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int
                                              ((packed_uint<8U> *)
                                               CONCAT44(in_stack_ffffffffffffff54,
                                                        in_stack_ffffffffffffff50));
                            if ((ktx2_transcoder *)0x7fffffff < (ktx2_transcoder *)(ulong)uVar4) {
                              local_1 = 0;
                              this = (ktx2_transcoder *)(ulong)uVar4;
                              goto LAB_001c856b;
                            }
                            uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int
                                              (in_stack_ffffffffffffff60);
                            if (uVar4 == 1) {
                              basisu::vector<basist::ktx2_level_index>::operator[]
                                        ((vector<basist::ktx2_level_index> *)
                                         CONCAT44(in_stack_ffffffffffffff54,
                                                  in_stack_ffffffffffffff50),
                                         CONCAT44(in_stack_ffffffffffffff4c,
                                                  in_stack_ffffffffffffff48));
                              uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int
                                                ((packed_uint<8U> *)
                                                 CONCAT44(in_stack_ffffffffffffff54,
                                                          in_stack_ffffffffffffff50));
                              if (uVar4 != 0) {
                                local_1 = 0;
                                this = (ktx2_transcoder *)(ulong)uVar4;
                                goto LAB_001c856b;
                              }
                            }
                            else {
                              uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int
                                                (in_stack_ffffffffffffff60);
                              if (1 < uVar4) {
                                basisu::vector<basist::ktx2_level_index>::operator[]
                                          ((vector<basist::ktx2_level_index> *)
                                           CONCAT44(in_stack_ffffffffffffff54,
                                                    in_stack_ffffffffffffff50),
                                           CONCAT44(in_stack_ffffffffffffff4c,
                                                    in_stack_ffffffffffffff48));
                                uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int
                                                  ((packed_uint<8U> *)
                                                   CONCAT44(in_stack_ffffffffffffff54,
                                                            in_stack_ffffffffffffff50));
                                if (uVar4 == 0) {
                                  local_1 = 0;
                                  this = (ktx2_transcoder *)(ulong)uVar4;
                                  goto LAB_001c856b;
                                }
                              }
                            }
                            local_24 = local_24 + 1;
                          }
                          uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int
                                            (in_stack_ffffffffffffff60);
                          if (uVar4 != 0x2c) {
                            uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int
                                              (in_stack_ffffffffffffff60);
                            if (uVar4 != 0x3c) {
                              local_1 = 0;
                              this = (ktx2_transcoder *)(ulong)uVar4;
                              goto LAB_001c856b;
                            }
                          }
                          uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int
                                            (in_stack_ffffffffffffff60);
                          uVar5 = basisu::packed_uint::operator_cast_to_unsigned_int
                                            (in_stack_ffffffffffffff60);
                          pkVar8 = (ktx2_transcoder *)(ulong)(uVar4 + uVar5);
                          if (uVar4 + uVar5 <= this->m_data_size) {
                            uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int
                                              (in_stack_ffffffffffffff60);
                            pkVar8 = (ktx2_transcoder *)(ulong)uVar4;
                            if ((ktx2_transcoder *)0x4f < pkVar8) {
                              puVar1 = this->m_pData;
                              uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int
                                                (in_stack_ffffffffffffff60);
                              this_00 = (packed_uint<4U> *)(puVar1 + uVar4);
                              basisu::packed_uint::operator_cast_to_unsigned_int
                                        (in_stack_ffffffffffffff60);
                              bVar2 = basisu::vector<unsigned_char>::try_resize
                                                ((vector<unsigned_char> *)
                                                 CONCAT44(in_stack_ffffffffffffff6c,
                                                          in_stack_ffffffffffffff68),
                                                 (size_t)in_stack_ffffffffffffff60,(bool)grow_hint);
                              if (bVar2) {
                                puVar9 = basisu::vector<unsigned_char>::data(&this->m_dfd);
                                this_02 = this_00;
                                uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int(this_00);
                                memcpy(puVar9,this_02,(ulong)uVar4);
                                uVar5 = basisu::read_le_dword((uint8_t *)this_00);
                                uVar4 = uVar5;
                                uVar6 = basisu::packed_uint::operator_cast_to_unsigned_int(this_02);
                                if (uVar4 == uVar6) {
                                  uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int
                                                    (this_02);
                                  if (uVar4 != 0) {
                                    in_stack_ffffffffffffff50 =
                                         basisu::packed_uint::operator_cast_to_unsigned_int(this_02)
                                    ;
                                    uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int
                                                      (this_02);
                                    in_stack_ffffffffffffff54 = uVar5;
                                    if (uVar5 != in_stack_ffffffffffffff50 - uVar4) {
                                      local_1 = 0;
                                      this = (ktx2_transcoder *)(ulong)uVar5;
                                      goto LAB_001c856b;
                                    }
                                  }
                                  uVar4 = basisu::read_le_dword(this_00[3].m_bytes);
                                  uVar5 = basisu::read_le_dword(this_00[7].m_bytes);
                                  this->m_dfd_color_model = uVar4 & 0xff;
                                  this->m_dfd_color_prims = uVar4 >> 8 & 0xff;
                                  this->m_dfd_transfer_func = uVar4 >> 0x10 & 0xff;
                                  this->m_dfd_flags = uVar4 >> 0x18;
                                  if ((this->m_dfd_transfer_func == 1) ||
                                     (this->m_dfd_transfer_func == 2)) {
                                    if (this->m_dfd_color_model == 0xa3) {
                                      this->m_format = cETC1S;
                                      uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int
                                                        (this_02);
                                      this->m_has_alpha = uVar4 == 0x3c;
                                      uVar4 = 1;
                                      if ((this->m_has_alpha & 1U) != 0) {
                                        uVar4 = 2;
                                      }
                                      this->m_dfd_samples = uVar4;
                                      this->m_dfd_chan0 = uVar5 >> 0x18 & KTX2_DF_CHANNEL_ETC1S_AAA;
                                      if ((this->m_has_alpha & 1U) != 0) {
                                        uVar4 = basisu::read_le_dword(this_00[0xb].m_bytes);
                                        this->m_dfd_chan1 =
                                             uVar4 >> 0x18 & KTX2_DF_CHANNEL_ETC1S_AAA;
                                      }
                                    }
                                    else {
                                      if (this->m_dfd_color_model != 0xa6) {
                                        local_1 = 0;
                                        goto LAB_001c856b;
                                      }
                                      this->m_format = cUASTC4x4;
                                      this->m_dfd_samples = 1;
                                      this->m_dfd_chan0 = uVar5 >> 0x18 & KTX2_DF_CHANNEL_ETC1S_AAA;
                                      uVar10 = (undefined3)in_stack_ffffffffffffff4c;
                                      in_stack_ffffffffffffff4c = CONCAT13(1,uVar10);
                                      if (this->m_dfd_chan0 != KTX2_DF_CHANNEL_ETC1S_RRR) {
                                        in_stack_ffffffffffffff4c =
                                             CONCAT13(this->m_dfd_chan0 ==
                                                      KTX2_DF_CHANNEL_UASTC_RRRG,uVar10);
                                      }
                                      this->m_has_alpha =
                                           SUB41((uint)in_stack_ffffffffffffff4c >> 0x18,0);
                                    }
                                    bVar2 = read_key_values((ktx2_transcoder *)
                                                            CONCAT44(uVar3,in_stack_ffffffffffffff88
                                                                    ));
                                    if (bVar2) {
                                      local_54 = 0;
                                      while( true ) {
                                        uVar3 = local_54;
                                        uVar4 = basisu::vector<basist::ktx2_transcoder::key_value>::
                                                size(&this->m_key_values);
                                        pkVar8 = (ktx2_transcoder *)(ulong)uVar3;
                                        if (uVar4 <= uVar3) break;
                                        this_01 = basisu::vector<basist::ktx2_transcoder::key_value>
                                                  ::operator[]((
                                                  vector<basist::ktx2_transcoder::key_value> *)
                                                  CONCAT44(in_stack_ffffffffffffff54,
                                                           in_stack_ffffffffffffff50),
                                                  CONCAT44(in_stack_ffffffffffffff4c,uVar3));
                                        puVar9 = basisu::vector<unsigned_char>::data
                                                           (&this_01->m_key);
                                        iVar7 = strcmp((char *)puVar9,"KTXanimData");
                                        if (iVar7 == 0) {
                                          this->m_is_video = true;
                                          pkVar8 = this;
                                          break;
                                        }
                                        local_54 = local_54 + 1;
                                      }
                                      local_1 = 1;
                                      this = pkVar8;
                                    }
                                    else {
                                      local_1 = 0;
                                      this = (ktx2_transcoder *)CONCAT71(extraout_var_01,bVar2);
                                    }
                                  }
                                  else {
                                    local_1 = 0;
                                  }
                                }
                                else {
                                  local_1 = 0;
                                  this = (ktx2_transcoder *)(ulong)uVar4;
                                }
                              }
                              else {
                                local_1 = 0;
                                this = (ktx2_transcoder *)CONCAT71(extraout_var_00,bVar2);
                              }
                              goto LAB_001c856b;
                            }
                          }
                          local_1 = 0;
                          this = pkVar8;
                        }
                      }
                      else {
                        local_1 = 0;
                        this = (ktx2_transcoder *)CONCAT71(extraout_var,bVar2);
                      }
                    }
                    else {
                      local_1 = 0;
                      this = (ktx2_transcoder *)(ulong)uVar4;
                    }
                  }
                  else {
                    local_1 = 0;
                    this = (ktx2_transcoder *)(ulong)uVar4;
                  }
                }
                goto LAB_001c856b;
              }
            }
          }
          local_1 = 0;
          this = pkVar8;
        }
        else {
          local_1 = 0;
          this = (ktx2_transcoder *)(ulong)uVar4;
        }
      }
      else {
        local_1 = 0;
        this = (ktx2_transcoder *)(ulong)uVar4;
      }
    }
    else {
      local_1 = 0;
      this = (ktx2_transcoder *)(ulong)uVar3;
    }
  }
LAB_001c856b:
  return (int)CONCAT71((int7)((ulong)this >> 8),local_1);
}

Assistant:

bool ktx2_transcoder::init(const void* pData, uint32_t data_size)
	{
		clear();

		if (!pData)
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::init: pData is nullptr\n");
			assert(0);
			return false;
		}

		if (data_size <= sizeof(ktx2_header))
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::init: File is impossibly too small to be a valid KTX2 file\n");
			return false;
		}

		if (memcmp(pData, g_ktx2_file_identifier, sizeof(g_ktx2_file_identifier)) != 0)
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::init: KTX2 file identifier is not present\n");
			return false;
		}

		m_pData = static_cast<const uint8_t *>(pData);
		m_data_size = data_size;

		memcpy((void*)&m_header, pData, sizeof(m_header));

		// We only support UASTC and ETC1S
		if (m_header.m_vk_format != KTX2_VK_FORMAT_UNDEFINED)
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::init: KTX2 file must be in ETC1S or UASTC format\n");
			return false;
		}

		// 3.3: "When format is VK_FORMAT_UNDEFINED, typeSize must equal 1."
		if (m_header.m_type_size != 1)
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::init: Invalid type_size\n");
			return false;
		}

		// We only currently support 2D textures (plain, cubemapped, or texture array), which is by far the most common use case.
		// The BasisU library does not support 1D or 3D textures at all.
		if ((m_header.m_pixel_width < 1) || (m_header.m_pixel_height < 1) || (m_header.m_pixel_depth > 0))
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::init: Only 2D or cubemap textures are supported\n");
			return false;
		}

		// Face count must be 1 or 6
		if ((m_header.m_face_count != 1) && (m_header.m_face_count != 6))
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::init: Invalid face count, file is corrupted or invalid\n");
			return false;
		}

		if (m_header.m_face_count > 1)
		{
			// 3.4: Make sure cubemaps are square.
			if (m_header.m_pixel_width != m_header.m_pixel_height)
			{
				BASISU_DEVEL_ERROR("ktx2_transcoder::init: Cubemap is not square\n");
				return false;
			}
		}
		
		// 3.7 levelCount: "levelCount=0 is allowed, except for block-compressed formats"
		if (m_header.m_level_count < 1)
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::init: Invalid level count\n");
			return false;
		}

		// Sanity check the level count.
		if (m_header.m_level_count > KTX2_MAX_SUPPORTED_LEVEL_COUNT)
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::init: Too many levels or file is corrupted or invalid\n");
			return false;
		}

		if (m_header.m_supercompression_scheme > KTX2_SS_ZSTANDARD)
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::init: Invalid/unsupported supercompression or file is corrupted or invalid\n");
			return false;
		}

		if (m_header.m_supercompression_scheme == KTX2_SS_BASISLZ)
		{
			if (m_header.m_sgd_byte_length <= sizeof(ktx2_etc1s_global_data_header))
			{
				BASISU_DEVEL_ERROR("ktx2_transcoder::init: Supercompression global data is too small\n");
				return false;
			}

			if (m_header.m_sgd_byte_offset < sizeof(ktx2_header))
			{
				BASISU_DEVEL_ERROR("ktx2_transcoder::init: Supercompression global data offset is too low\n");
				return false;
			}

			if (m_header.m_sgd_byte_offset + m_header.m_sgd_byte_length > m_data_size)
			{
				BASISU_DEVEL_ERROR("ktx2_transcoder::init: Supercompression global data offset and/or length is too high\n");
				return false;
			}
		}

		if (!m_levels.try_resize(m_header.m_level_count))
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::init: Out of memory\n");
			return false;
		}

		const uint32_t level_index_size_in_bytes = basisu::maximum(1U, (uint32_t)m_header.m_level_count) * sizeof(ktx2_level_index);

		if ((sizeof(ktx2_header) + level_index_size_in_bytes) > m_data_size)
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::init: File is too small (can't read level index array)\n");
			return false;
		}

		memcpy((void*)&m_levels[0], m_pData + sizeof(ktx2_header), level_index_size_in_bytes);
		
		// Sanity check the level offsets and byte sizes
		for (uint32_t i = 0; i < m_levels.size(); i++)
		{
			if (m_levels[i].m_byte_offset < sizeof(ktx2_header))
			{
				BASISU_DEVEL_ERROR("ktx2_transcoder::init: Invalid level offset (too low)\n");
				return false;
			}

			if (!m_levels[i].m_byte_length)
			{
				BASISU_DEVEL_ERROR("ktx2_transcoder::init: Invalid level byte length\n");
			}

			if ((m_levels[i].m_byte_offset + m_levels[i].m_byte_length) > m_data_size)
			{
				BASISU_DEVEL_ERROR("ktx2_transcoder::init: Invalid level offset and/or length\n");
				return false;
			}
			
			const uint64_t MAX_SANE_LEVEL_UNCOMP_SIZE = 2048ULL * 1024ULL * 1024ULL;
			
			if (m_levels[i].m_uncompressed_byte_length >= MAX_SANE_LEVEL_UNCOMP_SIZE)
			{
				BASISU_DEVEL_ERROR("ktx2_transcoder::init: Invalid level offset (too large)\n");
				return false;
			}

			if (m_header.m_supercompression_scheme == KTX2_SS_BASISLZ)
			{
				if (m_levels[i].m_uncompressed_byte_length)
				{
					BASISU_DEVEL_ERROR("ktx2_transcoder::init: Invalid uncompressed length (0)\n");
					return false;
				}
			}
			else if (m_header.m_supercompression_scheme >= KTX2_SS_ZSTANDARD)
			{
				if (!m_levels[i].m_uncompressed_byte_length)
				{
					BASISU_DEVEL_ERROR("ktx2_transcoder::init: Invalid uncompressed length (1)\n");
					return false;
				}
			}
		}

		const uint32_t DFD_MINIMUM_SIZE = 44, DFD_MAXIMUM_SIZE = 60;
		if ((m_header.m_dfd_byte_length != DFD_MINIMUM_SIZE) && (m_header.m_dfd_byte_length != DFD_MAXIMUM_SIZE))
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::init: Unsupported DFD size\n");
			return false;
		}

		if (((m_header.m_dfd_byte_offset + m_header.m_dfd_byte_length) > m_data_size) || (m_header.m_dfd_byte_offset < sizeof(ktx2_header)))
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::init: Invalid DFD offset and/or length\n");
			return false;
		}
				
		const uint8_t* pDFD = m_pData + m_header.m_dfd_byte_offset;

		if (!m_dfd.try_resize(m_header.m_dfd_byte_length))
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::init: Out of memory\n");
			return false;
		}

		memcpy(m_dfd.data(), pDFD, m_header.m_dfd_byte_length);
		
		// This is all hard coded for only ETC1S and UASTC.
		uint32_t dfd_total_size = basisu::read_le_dword(pDFD);
		
		// 3.10.3: Sanity check
		if (dfd_total_size != m_header.m_dfd_byte_length)
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::init: DFD size validation failed (1)\n");
			return false;
		}
				
		// 3.10.3: More sanity checking
		if (m_header.m_kvd_byte_length)
		{
			if (dfd_total_size != m_header.m_kvd_byte_offset - m_header.m_dfd_byte_offset)
			{
				BASISU_DEVEL_ERROR("ktx2_transcoder::init: DFD size validation failed (2)\n");
				return false;
			}
		}

		const uint32_t dfd_bits = basisu::read_le_dword(pDFD + 3 * sizeof(uint32_t));
		const uint32_t sample_channel0 = basisu::read_le_dword(pDFD + 7 * sizeof(uint32_t));
		 
		m_dfd_color_model = dfd_bits & 255;
		m_dfd_color_prims = (ktx2_df_color_primaries)((dfd_bits >> 8) & 255);
		m_dfd_transfer_func = (dfd_bits >> 16) & 255;
		m_dfd_flags = (dfd_bits >> 24) & 255;

		// See 3.10.1.Restrictions
		if ((m_dfd_transfer_func != KTX2_KHR_DF_TRANSFER_LINEAR) && (m_dfd_transfer_func != KTX2_KHR_DF_TRANSFER_SRGB))
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::init: Invalid DFD transfer function\n");
			return false;
		}

		if (m_dfd_color_model == KTX2_KDF_DF_MODEL_ETC1S)
		{
			m_format = basist::basis_tex_format::cETC1S;
			
			// 3.10.2: "Whether the image has 1 or 2 slices can be determined from the DFD's sample count."
			// If m_has_alpha is true it may be 2-channel RRRG or 4-channel RGBA, but we let the caller deal with that.
			m_has_alpha = (m_header.m_dfd_byte_length == 60);
			
			m_dfd_samples = m_has_alpha ? 2 : 1;
			m_dfd_chan0 = (ktx2_df_channel_id)((sample_channel0 >> 24) & 15);

			if (m_has_alpha)
			{
				const uint32_t sample_channel1 = basisu::read_le_dword(pDFD + 11 * sizeof(uint32_t));
				m_dfd_chan1 = (ktx2_df_channel_id)((sample_channel1 >> 24) & 15);
			}
		}
		else if (m_dfd_color_model == KTX2_KDF_DF_MODEL_UASTC)
		{
			m_format = basist::basis_tex_format::cUASTC4x4;

			m_dfd_samples = 1;
			m_dfd_chan0 = (ktx2_df_channel_id)((sample_channel0 >> 24) & 15);
			
			// We're assuming "DATA" means RGBA so it has alpha.
			m_has_alpha = (m_dfd_chan0 == KTX2_DF_CHANNEL_UASTC_RGBA) || (m_dfd_chan0 == KTX2_DF_CHANNEL_UASTC_RRRG);
		}
		else
		{
			// Unsupported DFD color model.
			BASISU_DEVEL_ERROR("ktx2_transcoder::init: Unsupported DFD color model\n");
			return false;
		}
				
		if (!read_key_values())
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::init: read_key_values() failed\n");
			return false;
		}

		// Check for a KTXanimData key
		for (uint32_t i = 0; i < m_key_values.size(); i++)
		{
			if (strcmp(reinterpret_cast<const char*>(m_key_values[i].m_key.data()), "KTXanimData") == 0)
			{
				m_is_video = true;
				break;
			}
		}

		return true;
	}